

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O3

int __thiscall
DirectionalScannerO1::nextOnRight
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pPVar8;
  bool *pbVar9;
  bool *pbVar10;
  int x;
  bool *pbVar11;
  int iVar12;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar8 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar8)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar8;
  }
  bVar2 = this->rstop;
  iVar12 = (this->super_DirectionalScanner).rcx;
  x = iVar12 + 1;
  (this->super_DirectionalScanner).rcx = x;
  if (bVar2 == true) {
    this->rstop = false;
  }
  else {
    pbVar11 = this->rst1;
    if (*pbVar11 == false) {
      pbVar9 = (this->super_DirectionalScanner).fs;
    }
    else {
      pbVar10 = (this->super_DirectionalScanner).rst2;
      if (*pbVar10 == true) {
        (this->super_DirectionalScanner).rcx = iVar12;
        this->rstop = true;
        x = iVar12;
      }
      piVar1 = &(this->super_DirectionalScanner).rcy;
      *piVar1 = *piVar1 + 1;
      pbVar10 = pbVar10 + 1;
      (this->super_DirectionalScanner).rst2 = pbVar10;
      pbVar9 = (this->super_DirectionalScanner).fs;
      if (pbVar9 <= pbVar10) {
        (this->super_DirectionalScanner).rst2 = (this->super_DirectionalScanner).steps;
      }
    }
    pbVar11 = pbVar11 + 1;
    this->rst1 = pbVar11;
    if (pbVar9 <= pbVar11) {
      this->rst1 = (this->super_DirectionalScanner).steps;
    }
  }
  iVar12 = (this->super_DirectionalScanner).rcy;
  pbVar11 = (this->super_DirectionalScanner).rst2;
  iVar3 = (this->super_DirectionalScanner).ymin;
  iVar4 = (this->super_DirectionalScanner).xmax;
  iVar5 = (this->super_DirectionalScanner).dla;
  iVar6 = (this->super_DirectionalScanner).dlb;
  iVar7 = (this->super_DirectionalScanner).dlc2;
  if (iVar12 < iVar3 || iVar4 <= x) {
    do {
      if (iVar6 * iVar12 + iVar5 * x < iVar7) break;
      iVar12 = iVar12 + 1;
      x = x - (uint)*pbVar11;
      pbVar11 = pbVar11 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar11) {
        pbVar11 = (this->super_DirectionalScanner).steps;
      }
    } while (iVar12 < iVar3 || iVar4 <= x);
  }
  if (((iVar7 <= iVar6 * iVar12 + iVar5 * x) && ((this->super_DirectionalScanner).xmin <= x)) &&
     (iVar12 < (this->super_DirectionalScanner).ymax)) {
    do {
      Pt2i::Pt2i(&PStack_38,x,iVar12);
      std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
      pbVar9 = pbVar11 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar9) {
        pbVar9 = (this->super_DirectionalScanner).steps;
      }
      x = x - (uint)*pbVar11;
      iVar12 = iVar12 + 1;
    } while ((((this->super_DirectionalScanner).dlc2 <=
               (this->super_DirectionalScanner).dlb * iVar12 +
               (this->super_DirectionalScanner).dla * x) &&
             ((this->super_DirectionalScanner).xmin <= x)) &&
            (pbVar11 = pbVar9, iVar12 < (this->super_DirectionalScanner).ymax));
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnRight (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (rstop)
  {
    rcx ++;
    rstop = false;
  }
  else
  {
    rcx ++;
    if (*rst1)
    {
      if (*rst2)
      {
        rcx --;
        rstop = true;
      }
      rcy ++;
      if (++rst2 >= fs) rst2 = steps;
    }
    if (++rst1 >= fs) rst1 = steps;
  }

  // Computes the next scan
  int x = rcx;
  int y = rcy;
  bool *nst = rst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}